

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

bool __thiscall Lib::DArray<Lib::DArray<int>_>::ensure(DArray<Lib::DArray<int>_> *this,size_t s)

{
  unsigned_long *puVar1;
  void *placement;
  DArray<int> *pDVar2;
  ulong in_RSI;
  DArray<int> *in_RDI;
  DArray<int> *newArray;
  void *mem;
  size_t newCapacity;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc8;
  unsigned_long local_28;
  unsigned_long local_20;
  ulong local_18 [2];
  bool local_1;
  
  if (in_RDI->_capacity < in_RSI) {
    local_28 = in_RDI->_capacity << 1;
    local_18[0] = in_RSI;
    puVar1 = std::max<unsigned_long>(local_18,&local_28);
    local_20 = *puVar1;
    placement = Lib::alloc((size_t)in_RDI);
    pDVar2 = array_new<Lib::DArray<int>>(placement,in_stack_ffffffffffffffc8);
    if (in_RDI->_array != (int *)0x0) {
      array_delete<Lib::DArray<int>>(in_RDI,in_stack_ffffffffffffffb8);
      Lib::free(in_RDI->_array);
    }
    in_RDI->_size = local_18[0];
    in_RDI->_capacity = local_20;
    in_RDI->_array = (int *)pDVar2;
    local_1 = false;
  }
  else {
    in_RDI->_size = in_RSI;
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool ensure(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return true;
    }

    size_t newCapacity = std::max(s, _capacity*2);

    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");
    C* newArray=array_new<C>(mem, newCapacity);

    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
    _size = s;
    _capacity = newCapacity;
    _array = newArray;
    return false;
  }